

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGValidatePopElement(xmlRelaxNGValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem)

{
  int iVar1;
  xmlRegExecCtxtPtr exec;
  uint uVar2;
  
  uVar2 = 0xffffffff;
  if (((ctxt != (xmlRelaxNGValidCtxtPtr)0x0) && (elem != (xmlNodePtr)0x0)) &&
     (ctxt->elem != (xmlRegExecCtxtPtr)0x0)) {
    exec = xmlRelaxNGElemPop(ctxt);
    iVar1 = xmlRegExecPushString(exec,(xmlChar *)0x0,(void *)0x0);
    if (iVar1 == 0) {
      xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_NOELEM,"",(xmlChar *)0x0,0);
      uVar2 = 0xffffffff;
    }
    else {
      uVar2 = iVar1 >> 0x1f | 1;
    }
    xmlRegFreeExecCtxt(exec);
  }
  return uVar2;
}

Assistant:

int
xmlRelaxNGValidatePopElement(xmlRelaxNGValidCtxtPtr ctxt,
                             xmlDocPtr doc ATTRIBUTE_UNUSED,
                             xmlNodePtr elem)
{
    int ret;
    xmlRegExecCtxtPtr exec;

    if ((ctxt == NULL) || (ctxt->elem == NULL) || (elem == NULL))
        return (-1);
#ifdef DEBUG_PROGRESSIVE
    xmlGenericError(xmlGenericErrorContext, "PopElem %s\n", elem->name);
#endif
    /*
     * verify that we reached a terminal state of the content model.
     */
    exec = xmlRelaxNGElemPop(ctxt);
    ret = xmlRegExecPushString(exec, NULL, NULL);
    if (ret == 0) {
        /*
         * TODO: get some of the names needed to exit the current state of exec
         */
        VALID_ERR2(XML_RELAXNG_ERR_NOELEM, BAD_CAST "");
        ret = -1;
    } else if (ret < 0) {
        ret = -1;
    } else {
        ret = 1;
    }
    xmlRegFreeExecCtxt(exec);
#ifdef DEBUG_PROGRESSIVE
    if (ret < 0)
        xmlGenericError(xmlGenericErrorContext, "PopElem %s failed\n",
                        elem->name);
#endif
    return (ret);
}